

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_reader_init(mpack_reader_t *reader,char *buffer,size_t size,size_t count)

{
  size_t count_local;
  size_t size_local;
  char *buffer_local;
  mpack_reader_t *reader_local;
  
  memset(reader,0,0x50);
  reader->buffer = buffer;
  reader->size = size;
  reader->data = buffer;
  reader->end = buffer + count;
  return;
}

Assistant:

void mpack_reader_init(mpack_reader_t* reader, char* buffer, size_t size, size_t count) {
    mpack_assert(buffer != NULL, "buffer is NULL");

    mpack_memset(reader, 0, sizeof(*reader));
    reader->buffer = buffer;
    reader->size = size;
    reader->data = buffer;
    reader->end = buffer + count;

    #if MPACK_READ_TRACKING
    mpack_reader_flag_if_error(reader, mpack_track_init(&reader->track));
    #endif

    mpack_log("===========================\n");
    mpack_log("initializing reader with buffer size %i\n", (int)size);
}